

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

void __thiscall Liby::Connection::handleReadEvent(Connection *this)

{
  Buffer *this_00;
  long lVar1;
  ulong uVar2;
  int *piVar3;
  int in_ECX;
  long *in_FS_OFFSET;
  shared_ptr<Liby::Connection> x;
  iovec iov [2];
  
  this_00 = &this->readBuf_;
  iov[0].iov_base = Buffer::wdata(this_00);
  iov[0].iov_len = Buffer::availbleSize(this_00);
  lVar1 = *in_FS_OFFSET;
  iov[1].iov_len = 0x4000;
  iov[1].iov_base = (char *)(lVar1 + -0x4000);
  uVar2 = Socket::readv((this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,(int)iov,(iovec *)0x2,in_ECX);
  if ((int)uVar2 < 1) {
    if (((int)uVar2 != 0) && (piVar3 = __errno_location(), *piVar3 == 0xb)) {
      return;
    }
    handleErroEvent(this);
  }
  else {
    uVar2 = uVar2 & 0xffffffff;
    if (iov[0].iov_len < uVar2) {
      Buffer::append(this_00,iov[0].iov_len);
      Buffer::append(this_00,(char *)(lVar1 + -0x4000),uVar2 - iov[0].iov_len);
    }
    else {
      Buffer::append(this_00,uVar2);
    }
    if ((this->readEventCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Liby::Connection,void>
                ((__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> *)&x,
                 (__weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<Liby::Connection>);
      std::function<void_(Liby::Connection_&)>::operator()(&this->readEventCallback_,this);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&x.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
  }
  return;
}

Assistant:

void Connection::handleReadEvent() {
    Buffer &buffer = readBuf_;

    struct iovec iov[2];
    iov[0].iov_base = buffer.wdata();
    iov[0].iov_len = buffer.availbleSize();
    iov[1].iov_base = extraBuffer;
    iov[1].iov_len = sizeof(extraBuffer);

    int ret = socket_->readv(iov, 2);

    if (ret > 0) {
        if (static_cast<decltype(iov[0].iov_len)>(ret) > iov[0].iov_len) {
            buffer.append(iov[0].iov_len);
            buffer.append(extraBuffer, ret - iov[0].iov_len);
        } else {
            buffer.append(ret);
        }
    } else {
        if (ret != 0 && errno == EAGAIN) {
            return;
        } else {
            handleErroEvent();
            return;
        }
    }

    if (readEventCallback_) {
        auto x = shared_from_this();
        readEventCallback_(*this);
    }
}